

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

int __thiscall
CVmObjFileName::getp_getAbsolutePath
          (CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t obj;
  vm_filnam_ext *this_00;
  undefined8 *puVar2;
  long *plVar3;
  int *in_RCX;
  vm_val_t *in_RDX;
  CVmObjFileName *in_RDI;
  size_t buflen;
  size_t buflen_1;
  char *src;
  err_frame_t err_cur__;
  char *outbuf;
  char *buf;
  size_t fnamel;
  char *fname;
  uint argc;
  CVmNativeCodeDesc *in_stack_fffffffffffffe68;
  uint *in_stack_fffffffffffffe70;
  void *pvVar4;
  vm_val_t *in_stack_fffffffffffffe78;
  undefined8 uVar5;
  char *in_stack_fffffffffffffe80;
  char *pcVar6;
  size_t in_stack_fffffffffffffe88;
  int local_164;
  char *local_148;
  uint local_140 [2];
  undefined8 local_138;
  void *local_130;
  __jmp_buf_tag _Stack_128;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  int local_2c;
  vm_val_t *local_20;
  
  if (in_RCX == (int *)0x0) {
    local_164 = 0;
  }
  else {
    local_164 = *in_RCX;
  }
  local_2c = local_164;
  local_20 = in_RDX;
  if ((getp_getAbsolutePath(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getAbsolutePath(unsigned_int,vm_val_t*,unsigned_int*)::desc)
     , iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getAbsolutePath::desc,0);
    __cxa_guard_release(&getp_getAbsolutePath(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  if (iVar1 == 0) {
    this_00 = get_ext(in_RDI);
    local_48 = vm_filnam_ext::get_str(this_00);
    get_ext(in_RDI);
    local_50 = (char *)vm_filnam_ext::get_len((vm_filnam_ext *)0x2e6f39);
    local_58 = (char *)0x0;
    local_60 = (char *)0x0;
    puVar2 = (undefined8 *)_ZTW11G_err_frame();
    local_138 = *puVar2;
    plVar3 = (long *)_ZTW11G_err_frame();
    *plVar3 = (long)local_140;
    local_140[0] = _setjmp(&_Stack_128);
    if (local_140[0] == 0) {
      local_148 = local_48;
      iVar1 = fn_is_file_absolute((char *)in_stack_fffffffffffffe68);
      if (iVar1 == 0) {
        pcVar6 = local_50;
        strlen(G_file_path_X);
        local_58 = lib_alloc_str((size_t)in_stack_fffffffffffffe70);
        fn_build_full_path(pcVar6,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                           (char *)in_stack_fffffffffffffe78,
                           (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
        local_148 = local_58;
      }
      strlen(local_148);
      local_60 = lib_alloc_str((size_t)in_stack_fffffffffffffe70);
      iVar1 = fn_get_abs_filename((char *)in_stack_fffffffffffffe78,
                                  (size_t)in_stack_fffffffffffffe70,
                                  (char *)in_stack_fffffffffffffe68);
      if (iVar1 == 0) {
        vm_val_t::set_nil(local_20);
      }
      else {
        pcVar6 = local_60;
        strlen(local_60);
        obj = CVmObjString::create
                        ((int)((ulong)pcVar6 >> 0x20),(char *)in_stack_fffffffffffffe78,
                         (size_t)in_stack_fffffffffffffe70);
        vm_val_t::set_obj(local_20,obj);
      }
    }
    if ((local_140[0] & 0x8000) == 0) {
      local_140[0] = local_140[0] | 0x8000;
      lib_free_str((char *)0x2e710e);
      lib_free_str((char *)0x2e711b);
    }
    uVar5 = local_138;
    puVar2 = (undefined8 *)_ZTW11G_err_frame();
    *puVar2 = uVar5;
    if ((local_140[0] & 0x4001) != 0) {
      puVar2 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar2 & 2) != 0) {
        plVar3 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar3 + 0x10));
      }
      pvVar4 = local_130;
      plVar3 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar3 + 0x10) = pvVar4;
      err_rethrow();
    }
    if ((local_140[0] & 2) != 0) {
      free(local_130);
    }
    CVmStack::discard(local_2c);
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_getAbsolutePath(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get our local filename string */
    const char *fname = get_ext()->get_str();
    size_t fnamel = get_ext()->get_len();

    /* we haven't allocated any strings yet */
    char *buf = 0, *outbuf = 0;

    err_try
    {
        /* 
         *   if it's not absolute already, combine it with our internal
         *   working directory to get the fully qualified path
         */
        const char *src = fname;
        if (!fn_is_file_absolute(vmg_ fname))
        {
            /* allocate space for the combined path */
            size_t buflen = fnamel + strlen(G_file_path) + 32;
            if (buflen < OSFNMAX)
                buflen = OSFNMAX;

            /* build the combined path */
            buf = lib_alloc_str(buflen);
            fn_build_full_path(vmg_ buf, buflen, G_file_path, fname, TRUE);

            /* use this as the new source path */
            src = buf;
        }

        /* 
         *   Even though the name should already be absolute, run it through
         *   os_get_abs_filename() anyway, since that will convert the name
         *   to a more canonical format on many systems. 
         */

        /* figure how much space we'll need, adding some padding */
        size_t buflen = strlen(src) + 32;
        if (buflen < OSFNMAX)
            buflen = OSFNMAX;

        /* allocate the buffer and do the conversion */
        outbuf = lib_alloc_str(buflen);
        if (fn_get_abs_filename(vmg_ outbuf, buflen, src))
        {
            /* success - return the result string */
            retval->set_obj(CVmObjString::create(
                vmg_ FALSE, outbuf, strlen(outbuf)));
        }
        else
        {
            /* failure - return nil */
            retval->set_nil();
        }
    }